

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (SegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,bool excludeGuardPages)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  PageAllocatorBaseCommon *pPVar4;
  code *pcVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  undefined4 *puVar9;
  UINT_PTR UVar10;
  char *pcVar11;
  AllocatorType *pAVar12;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar13;
  ulong pageCount;
  byte bVar14;
  
  if (this->address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x58,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar6) goto LAB_0070253b;
    *puVar9 = 0;
  }
  if (excludeGuardPages) {
    bVar14 = 0;
  }
  else {
    bVar6 = 0x100000 < this->segmentPageCount << 0xc;
    bVar14 = bVar6 | DAT_015b0239;
    if (bVar6 || (DAT_015b0239 & 1) != 0) {
      UVar10 = Math::Rand();
      this->leadingGuardPageCount = (int)UVar10 + (int)((UVar10 & 0xffffffff) / 0xf) * -0xf + 1;
      this->trailingGuardPageCount = 1;
      bVar14 = 1;
    }
  }
  uVar1 = this->trailingGuardPageCount;
  uVar2 = this->leadingGuardPageCount;
  sVar3 = this->segmentPageCount;
  uVar8 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
  pageCount = -(ulong)uVar8 & (uVar2 + sVar3 + (ulong)uVar1 + (ulong)uVar8) - 1;
  this->segmentPageCount = pageCount - (this->trailingGuardPageCount + this->leadingGuardPageCount);
  pPVar4 = (this->super_SegmentBaseCommon).allocator;
  pAVar12 = &pPVar4[-1].allocatorType;
  if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
    pAVar12 = (AllocatorType *)0x0;
  }
  if (*(char *)((long)pAVar12 + 0xbe) == '\0') {
    if ((*(AllocationPolicyManager **)(pAVar12 + 0x32) != (AllocationPolicyManager *)0x0) &&
       (bVar6 = AllocationPolicyManager::RequestAlloc
                          (*(AllocationPolicyManager **)(pAVar12 + 0x32),pageCount << 0xc,false),
       !bVar6)) {
      return false;
    }
    pPVar4 = (this->super_SegmentBaseCommon).allocator;
    pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *)&pPVar4[-1].allocatorType;
    if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
      pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::GetVirtualAllocator(pPVar13);
    pPVar4 = (this->super_SegmentBaseCommon).allocator;
    pAVar12 = &pPVar4[-1].allocatorType;
    if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
      pAVar12 = (AllocatorType *)0x0;
    }
    pcVar11 = (char *)VirtualAllocWrapper::AllocPages
                                ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,(LPVOID)0x0,
                                 pageCount,allocFlags | 0x2000,4,pAVar12[0x50] == 2);
    this->address = pcVar11;
    if (pcVar11 == (char *)0x0) {
      pPVar4 = (this->super_SegmentBaseCommon).allocator;
      pAVar12 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar12 = (AllocatorType *)0x0;
      }
      if (*(char *)((long)pAVar12 + 0xbd) == '\x01') {
        *(undefined1 *)((long)pAVar12 + 0xbe) = 1;
      }
      if (*(AllocationPolicyManager **)(pAVar12 + 0x32) != (AllocationPolicyManager *)0x0) {
        AllocationPolicyManager::ReportFailure
                  (*(AllocationPolicyManager **)(pAVar12 + 0x32),pageCount << 0xc);
      }
    }
    else {
      if ((short)pcVar11 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x86,"(((ULONG_PTR)this->address % (64 * 1024)) == 0)",
                           "((ULONG_PTR)this->address % (64 * 1024)) == 0");
        if (!bVar6) {
LAB_0070253b:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
      pcVar11 = this->address;
      if ((bVar14 & 1) != 0) {
        if (DAT_015b023a == '\x01') {
          Output::Print(L"Number of Leading Guard Pages: %d\n",(ulong)this->leadingGuardPageCount);
        }
        if (DAT_015b023a == '\x01') {
          Output::Print(L"Starting address of Leading Guard Pages: 0x%p\n",this->address);
        }
        if (DAT_015b023a == '\x01') {
          Output::Print(L"Offset of Segment Start address: 0x%p\n",
                        this->address + (this->leadingGuardPageCount << 0xc));
        }
        if (DAT_015b023a == '\x01') {
          Output::Print(L"Starting address of Trailing Guard Pages: 0x%p\n",
                        this->address +
                        ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000);
        }
        if ((allocFlags >> 0xc & 1) != 0) {
          pPVar4 = (this->super_SegmentBaseCommon).allocator;
          pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar4[-1].allocatorType;
          if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
            pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar13);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,this->address,
                     (ulong)(this->leadingGuardPageCount << 0xc),0x4000);
          pPVar4 = (this->super_SegmentBaseCommon).allocator;
          pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)&pPVar4[-1].allocatorType;
          if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
            pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                       *)0x0;
          }
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::GetVirtualAllocator(pPVar13);
          VirtualAllocWrapper::Free
                    ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,
                     this->address +
                     ((ulong)this->leadingGuardPageCount + this->segmentPageCount) * 0x1000,
                     (ulong)(this->trailingGuardPageCount << 0xc),0x4000);
        }
        pPVar4 = (this->super_SegmentBaseCommon).allocator;
        pAVar12 = &pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          pAVar12 = (AllocatorType *)0x0;
        }
        if (*(AllocationPolicyManager **)(pAVar12 + 0x32) != (AllocationPolicyManager *)0x0) {
          AllocationPolicyManager::ReportFree
                    (*(AllocationPolicyManager **)(pAVar12 + 0x32),
                     (ulong)((this->trailingGuardPageCount + this->leadingGuardPageCount) * 0x1000))
          ;
        }
        this->address = this->address + (this->leadingGuardPageCount << 0xc);
      }
      pPVar4 = (this->super_SegmentBaseCommon).allocator;
      pAVar12 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar12 = (AllocatorType *)0x0;
      }
      cVar7 = (**(code **)(*(long *)pAVar12 + 0x30))
                        (pAVar12,this,allocFlags >> 0xc & 1,&this->secondaryAllocator);
      if (cVar7 != '\0') {
        if ((DAT_015d641c != '\x01') || (bVar6 = true, (this->field_0x2c & 2) != 0)) {
          bVar6 = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address,this->segmentPageCount);
        }
        if (bVar6 != false) {
          bVar14 = this->field_0x2c;
          this->field_0x2c = bVar14 | 1;
          if ((bVar14 & 2) == 0) {
            return bVar6;
          }
          RecyclerWriteBarrierManager::ToggleBarrier
                    (this->address,this->segmentPageCount << 0xc,true);
          return bVar6;
        }
        pPVar4 = (this->super_SegmentBaseCommon).allocator;
        pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)&pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                     *)0x0;
        }
        PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ::GetVirtualAllocator(pPVar13);
        VirtualAllocWrapper::Free
                  ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,pcVar11,
                   this->segmentPageCount << 0xc,0x8000);
        pPVar4 = (this->super_SegmentBaseCommon).allocator;
        sVar3 = this->segmentPageCount;
        pAVar12 = &pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          pAVar12 = (AllocatorType *)0x0;
        }
        if (*(char *)((long)pAVar12 + 0xbd) == '\x01') {
          *(undefined1 *)((long)pAVar12 + 0xbe) = 1;
        }
        if (*(AllocationPolicyManager **)(pAVar12 + 0x32) != (AllocationPolicyManager *)0x0) {
          AllocationPolicyManager::ReportFailure
                    (*(AllocationPolicyManager **)(pAVar12 + 0x32),sVar3 << 0xc);
        }
        this->address = (char *)0x0;
        return false;
      }
      pPVar4 = (this->super_SegmentBaseCommon).allocator;
      pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *)&pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pPVar13 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                   *)0x0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::GetVirtualAllocator(pPVar13);
      VirtualAllocWrapper::Free
                ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,pcVar11,
                 this->segmentPageCount << 0xc,0x8000);
      pPVar4 = (this->super_SegmentBaseCommon).allocator;
      sVar3 = this->segmentPageCount;
      pAVar12 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar12 = (AllocatorType *)0x0;
      }
      if (*(char *)((long)pAVar12 + 0xbd) == '\x01') {
        *(undefined1 *)((long)pAVar12 + 0xbe) = 1;
      }
      if (*(AllocationPolicyManager **)(pAVar12 + 0x32) != (AllocationPolicyManager *)0x0) {
        AllocationPolicyManager::ReportFailure
                  (*(AllocationPolicyManager **)(pAVar12 + 0x32),sVar3 << 0xc);
      }
      this->address = (char *)0x0;
    }
  }
  return false;
}

Assistant:

bool
SegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(this->address == nullptr);
    char* originalAddress = nullptr;
    bool addGuardPages = false;
    if (!excludeGuardPages)
    {
        addGuardPages = (this->segmentPageCount * AutoSystemInfo::PageSize) > VirtualAllocThreshold;
#if TARGET_32
        unsigned int randomNumber2 = static_cast<unsigned int>(Math::Rand());
        addGuardPages = addGuardPages && (randomNumber2 % 4 == 1);
#endif
#if DEBUG
        addGuardPages = addGuardPages || Js::Configuration::Global.flags.ForceGuardPages;
#endif
        if (addGuardPages)
        {
            unsigned int randomNumber = static_cast<unsigned int>(Math::Rand());
            this->leadingGuardPageCount = randomNumber % maxGuardPages + minGuardPages;
            this->trailingGuardPageCount = minGuardPages;
        }
    }

    // We can only allocate with this granularity using VirtualAlloc
    size_t totalPages = Math::Align<size_t>(this->segmentPageCount + leadingGuardPageCount + trailingGuardPageCount, AutoSystemInfo::Data.GetAllocationGranularityPageCount());
    this->segmentPageCount = totalPages - (leadingGuardPageCount + trailingGuardPageCount);

#ifdef FAULT_INJECTION
    if (Js::FaultInjection::Global.ShouldInjectFault(Js::FaultInjection::Global.NoThrow))
    {
        this->address = nullptr;
        return false;
    }
#endif

    if (!this->GetAllocator()->RequestAlloc(totalPages * AutoSystemInfo::PageSize))
    {
        return false;
    }

    this->address = (char *)GetAllocator()->GetVirtualAllocator()->AllocPages(NULL, totalPages, MEM_RESERVE | allocFlags, PAGE_READWRITE, this->IsInCustomHeapAllocator());

    if (this->address == nullptr)
    {
        this->GetAllocator()->ReportFailure(totalPages * AutoSystemInfo::PageSize);
        return false;
    }

    Assert( ((ULONG_PTR)this->address % (64 * 1024)) == 0 );

    originalAddress = this->address;
    bool committed = (allocFlags & MEM_COMMIT) != 0;
    if (addGuardPages)
    {
#if DBG_DUMP
        GUARD_PAGE_TRACE(_u("Number of Leading Guard Pages: %d\n"), leadingGuardPageCount);
        GUARD_PAGE_TRACE(_u("Starting address of Leading Guard Pages: 0x%p\n"), address);
        GUARD_PAGE_TRACE(_u("Offset of Segment Start address: 0x%p\n"), this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize));
        GUARD_PAGE_TRACE(_u("Starting address of Trailing Guard Pages: 0x%p\n"), address + ((leadingGuardPageCount + this->segmentPageCount)*AutoSystemInfo::PageSize));
#endif
        if (committed)
        {
            GetAllocator()->GetVirtualAllocator()->Free(address,
              leadingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);

            GetAllocator()->GetVirtualAllocator()->Free(address +
              ((leadingGuardPageCount + this->segmentPageCount) * AutoSystemInfo::PageSize),
              trailingGuardPageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        }
        this->GetAllocator()->ReportFree((leadingGuardPageCount + trailingGuardPageCount) * AutoSystemInfo::PageSize);

        this->address = this->address + (leadingGuardPageCount*AutoSystemInfo::PageSize);
    }

    if (!GetAllocator()->CreateSecondaryAllocator(this, committed, &this->secondaryAllocator))
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }

#ifdef RECYCLER_WRITE_BARRIER
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
    bool registerBarrierResult = true;
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (CONFIG_FLAG(StrictWriteBarrierCheck))
    {
        if (this->isWriteBarrierEnabled)
        {
            // only commit card table for write barrier pages for strict check
            // we can do this in free build if all write barrier annotated struct
            // only allocate with write barrier pages
            registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
        }
    }
    else
#endif
    {
        registerBarrierResult = RecyclerWriteBarrierManager::OnSegmentAlloc(this->address, this->segmentPageCount);
    }

    if (!registerBarrierResult)
    {
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress,
          GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        this->GetAllocator()->ReportFailure(GetPageCount() * AutoSystemInfo::PageSize);
        this->address = nullptr;
        return false;
    }
#endif

    this->isWriteBarrierAllowed = true;
#if DBG

    if (this->isWriteBarrierEnabled)
    {
        RecyclerWriteBarrierManager::ToggleBarrier(this->address,
          this->segmentPageCount * AutoSystemInfo::PageSize, true);
    }
#endif
#endif

    return true;
}